

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

void capnp::compiler::parseFile
               (Reader statements,Builder result,ErrorReporter *errorReporter,bool requiresId)

{
  Reader statement_00;
  Builder builder_00;
  undefined1 auVar1 [32];
  undefined8 uVar2;
  bool bVar3;
  Which WVar4;
  Which WVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  Parsers *pPVar10;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *other;
  size_t sVar11;
  Orphan<capnp::compiler::Declaration> *pOVar12;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar13;
  char (*in_R8) [2];
  Orphanage orphanageParam;
  Iterator IVar14;
  undefined8 in_stack_fffffffffffff990;
  size_t local_580;
  size_t i_1;
  Builder annotationsBuilder;
  size_t i;
  Builder declsBuilder;
  String local_500;
  StringPtr local_4e8;
  Builder local_4d8;
  Builder local_4b0;
  uint64_t local_488;
  uint64_t id;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> local_458;
  Orphan<capnp::Text> local_438;
  Orphan<capnp::compiler::LocatedInteger> local_418;
  Builder local_3f8;
  StringPtr local_3d0;
  Builder local_3c0;
  undefined1 local_398 [8];
  Builder builder;
  Orphan<capnp::compiler::Declaration> *decl;
  Maybe<capnp::Orphan<capnp::compiler::Declaration>_> local_330;
  undefined1 local_308 [8];
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> _decl82;
  Reader statement;
  undefined1 local_2a0 [8];
  Iterator __end2;
  undefined1 local_280 [8];
  Iterator __begin2;
  Reader *__range2;
  undefined1 local_260 [8];
  Builder fileDecl;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> annotations;
  undefined1 local_208 [8];
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> decls;
  undefined1 local_1b0 [8];
  CapnpParser parser;
  bool requiresId_local;
  ErrorReporter *errorReporter_local;
  
  decls.builder.disposer = (ArrayDisposer *)result._builder.segment;
  auVar1 = result._builder._8_32_;
  builder_00._builder._32_8_ = in_stack_fffffffffffff990;
  builder_00._builder.segment = (SegmentBuilder *)auVar1._0_8_;
  builder_00._builder.capTable = (CapTableBuilder *)auVar1._8_8_;
  builder_00._builder.data = (void *)auVar1._16_8_;
  builder_00._builder.pointers = (WirePointer *)auVar1._24_8_;
  parser.parsers.annotationDecl.wrapper._7_1_ = requiresId;
  orphanageParam =
       Orphanage::getForMessageContaining<capnp::compiler::ParsedFile::Builder>(builder_00);
  CapnpParser::CapnpParser((CapnpParser *)local_1b0,orphanageParam,errorReporter);
  uVar6 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::size(&statements);
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208,(ulong)uVar6);
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
             &fileDecl._builder.dataSize);
  ParsedFile::Builder::getRoot((Builder *)local_260,&result);
  Declaration::Builder::setFile((Builder *)local_260);
  __begin2._8_8_ = &statements;
  IVar14 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::begin(&statements);
  __end2._8_8_ = IVar14.container;
  __begin2.container._0_4_ = IVar14.index;
  local_280 = (undefined1  [8])__end2._8_8_;
  IVar14 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  local_2a0 = (undefined1  [8])IVar14.container;
  __end2.container._0_4_ = IVar14.index;
  while (bVar3 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                               *)local_280,
                              (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                               *)local_2a0), ((bVar3 ^ 0xffU) & 1) != 0) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
    ::operator*((Reader *)&_decl82.field_1.value.builder.location,
                (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                 *)local_280);
    uVar2 = _decl82.field_1.value.builder.location;
    pPVar10 = CapnpParser::getParsers((CapnpParser *)local_1b0);
    statement_00._reader.capTable = (CapTableReader *)statement._reader.segment;
    statement_00._reader.segment = (SegmentReader *)uVar2;
    statement_00._reader.data = statement._reader.capTable;
    statement_00._reader.pointers = (WirePointer *)statement._reader.data;
    statement_00._reader._32_8_ = statement._reader.pointers;
    statement_00._reader._40_8_ = statement._reader._32_8_;
    CapnpParser::parseStatement
              (&local_330,(CapnpParser *)local_1b0,statement_00,&pPVar10->fileLevelDecl);
    other = kj::_::readMaybe<capnp::Orphan<capnp::compiler::Declaration>>(&local_330);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_308,other);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::~Maybe(&local_330);
    pOVar12 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_308);
    if (pOVar12 != (Orphan<capnp::compiler::Declaration> *)0x0) {
      builder._builder._32_8_ =
           kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::operator*
                     ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_308);
      Orphan<capnp::compiler::Declaration>::get
                ((BuilderFor<capnp::compiler::Declaration> *)local_398,
                 (Orphan<capnp::compiler::Declaration> *)builder._builder._32_8_);
      WVar4 = Declaration::Builder::which((Builder *)local_398);
      if (WVar4 == NAKED_ID) {
        Declaration::Builder::getId(&local_3c0,(Builder *)local_260);
        bVar3 = Declaration::Id::Builder::isUid(&local_3c0);
        if (bVar3) {
          uVar7 = Declaration::Builder::getStartByte((Builder *)local_398);
          uVar8 = Declaration::Builder::getEndByte((Builder *)local_398);
          kj::StringPtr::StringPtr(&local_3d0,"File can only have one ID.");
          in_R8 = (char (*) [2])local_3d0.content.size_;
          (**errorReporter->_vptr_ErrorReporter)
                    (errorReporter,(ulong)uVar7,(ulong)uVar8,local_3d0.content.ptr);
        }
        else {
          Declaration::Builder::getId(&local_3f8,(Builder *)local_260);
          Declaration::Builder::disownNakedId(&local_418,(Builder *)local_398);
          Declaration::Id::Builder::adoptUid(&local_3f8,&local_418);
          Orphan<capnp::compiler::LocatedInteger>::~Orphan(&local_418);
          bVar3 = Declaration::Builder::hasDocComment((Builder *)local_398);
          if (bVar3) {
            Declaration::Builder::disownDocComment(&local_438,(Builder *)local_398);
            Declaration::Builder::adoptDocComment((Builder *)local_260,&local_438);
            Orphan<capnp::Text>::~Orphan(&local_438);
          }
        }
      }
      else if (WVar4 == NAKED_ANNOTATION) {
        Declaration::Builder::disownNakedAnnotation(&local_458,(Builder *)local_398);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>::
        add<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>> *)
                   &fileDecl._builder.dataSize,&local_458);
        Orphan<capnp::compiler::Declaration::AnnotationApplication>::~Orphan(&local_458);
      }
      else {
        pOVar12 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>
                            ((Orphan<capnp::compiler::Declaration> *)builder._builder._32_8_);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>>::
        add<capnp::Orphan<capnp::compiler::Declaration>>
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration>> *)local_208,pOVar12);
      }
    }
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_308);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                  *)local_280);
  }
  Declaration::Builder::getId((Builder *)&id,(Builder *)local_260);
  WVar5 = Declaration::Id::Builder::which((Builder *)&id);
  if (WVar5 != UID) {
    local_488 = generateRandomId();
    Declaration::Builder::getId(&local_4d8,(Builder *)local_260);
    Declaration::Id::Builder::initUid(&local_4b0,&local_4d8);
    LocatedInteger::Builder::setValue(&local_4b0,local_488);
    if (((parser.parsers.annotationDecl.wrapper._7_1_ & 1) != 0) &&
       (uVar9 = (*errorReporter->_vptr_ErrorReporter[1])(), (uVar9 & 1) == 0)) {
      kj::hex((CappedArray<char,_17UL> *)&declsBuilder.builder.structDataSize,local_488);
      kj::str<char_const(&)[91],kj::CappedArray<char,17ul>,char_const(&)[2]>
                (&local_500,
                 (kj *)
                 "File does not declare an ID.  I\'ve generated one for you.  Add this line to your file: @0x"
                 ,(char (*) [91])&declsBuilder.builder.structDataSize,(CappedArray<char,_17UL> *)";"
                 ,in_R8);
      kj::StringPtr::StringPtr(&local_4e8,&local_500);
      (**errorReporter->_vptr_ErrorReporter)
                (errorReporter,0,0,local_4e8.content.ptr,local_4e8.content.size_);
      kj::String::~String(&local_500);
    }
  }
  sVar11 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::size
                     ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208);
  Declaration::Builder::initNestedDecls((Builder *)&i,(Builder *)local_260,(uint)sVar11);
  annotationsBuilder.builder.structDataSize = 0;
  annotationsBuilder.builder.structPointerCount = 0;
  annotationsBuilder.builder.elementSize = VOID;
  annotationsBuilder.builder._39_1_ = 0;
  for (; uVar2 = annotationsBuilder.builder._32_8_,
      sVar11 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::size
                         ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208),
      (ulong)uVar2 < sVar11;
      annotationsBuilder.builder._32_8_ = annotationsBuilder.builder._32_8_ + 1) {
    uVar6 = annotationsBuilder.builder.structDataSize;
    pOVar12 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::operator[]
                        ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208,
                         annotationsBuilder.builder._32_8_);
    pOVar12 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>(pOVar12);
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::adoptWithCaveats
              ((Builder *)&i,uVar6,pOVar12);
  }
  sVar11 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                     ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *
                      )&fileDecl._builder.dataSize);
  Declaration::Builder::initAnnotations((Builder *)&i_1,(Builder *)local_260,(uint)sVar11);
  for (local_580 = 0;
      sVar11 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                         ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                           *)&fileDecl._builder.dataSize), local_580 < sVar11;
      local_580 = local_580 + 1) {
    pOVar13 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
              operator[]((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                          *)&fileDecl._builder.dataSize,local_580);
    pOVar13 = kj::mv<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>(pOVar13);
    List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Builder::
    adoptWithCaveats((Builder *)&i_1,(uint)local_580,pOVar13);
  }
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::~Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
             &fileDecl._builder.dataSize);
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::~Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208);
  CapnpParser::~CapnpParser((CapnpParser *)local_1b0);
  return;
}

Assistant:

void parseFile(List<Statement>::Reader statements, ParsedFile::Builder result,
               ErrorReporter& errorReporter, bool requiresId) {
  CapnpParser parser(Orphanage::getForMessageContaining(result), errorReporter);

  kj::Vector<Orphan<Declaration>> decls(statements.size());
  kj::Vector<Orphan<Declaration::AnnotationApplication>> annotations;

  auto fileDecl = result.getRoot();
  fileDecl.setFile(VOID);

  for (auto statement: statements) {
    KJ_IF_SOME(decl, parser.parseStatement(statement, parser.getParsers().fileLevelDecl)) {
      Declaration::Builder builder = decl.get();
      switch (builder.which()) {
        case Declaration::NAKED_ID:
          if (fileDecl.getId().isUid()) {
            errorReporter.addError(builder.getStartByte(), builder.getEndByte(),
                                   "File can only have one ID.");
          } else {
            fileDecl.getId().adoptUid(builder.disownNakedId());
            if (builder.hasDocComment()) {
              fileDecl.adoptDocComment(builder.disownDocComment());
            }
          }
          break;
        case Declaration::NAKED_ANNOTATION:
          annotations.add(builder.disownNakedAnnotation());
          break;
        default:
          decls.add(kj::mv(decl));
          break;
      }
    }
  }

  if (fileDecl.getId().which() != Declaration::Id::UID) {
    // We didn't see an ID. Generate one randomly for now.
    uint64_t id = generateRandomId();
    fileDecl.getId().initUid().setValue(id);

    // Don't report missing ID if there was a parse error, because quite often the parse error
    // prevents us from parsing the ID even though it is actually there.
    if (requiresId && !errorReporter.hadErrors()) {
      errorReporter.addError(0, 0,
          kj::str("File does not declare an ID.  I've generated one for you.  Add this line to "
                  "your file: @0x", kj::hex(id), ";"));
    }
  }

  auto declsBuilder = fileDecl.initNestedDecls(decls.size());
  for (size_t i = 0; i < decls.size(); i++) {
    declsBuilder.adoptWithCaveats(i, kj::mv(decls[i]));
  }

  auto annotationsBuilder = fileDecl.initAnnotations(annotations.size());
  for (size_t i = 0; i < annotations.size(); i++) {
    annotationsBuilder.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
}